

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O1

point_list_differences find_differences(Am_Point_List *old,Am_Point_List *newp,int *index_of_diff)

{
  bool bVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  int iVar4;
  point_list_differences pVar5;
  
  bVar1 = Am_Point_List::operator==(old,newp);
  if (bVar1) {
    return Am_PL_SAME;
  }
  uVar2 = Am_Point_List::Length(old);
  uVar3 = Am_Point_List::Length(newp);
  if (uVar2 == 0) {
    return Am_PL_FROM_NOTHING;
  }
  if (uVar3 == 0) {
    return Am_PL_TO_NOTHING;
  }
  if (uVar2 + 1 == (uint)uVar3) {
    iVar4 = find_point_diff(old,newp);
    *index_of_diff = iVar4;
    pVar5 = Am_PL_ADD_POINT;
  }
  else {
    if (uVar2 - 1 != (uint)uVar3) {
      return Am_PL_VERY_DIFFERENT;
    }
    iVar4 = find_point_diff(newp,old);
    *index_of_diff = iVar4;
    pVar5 = Am_PL_REMOVE_POINT;
  }
  if (iVar4 < 0) {
    return Am_PL_VERY_DIFFERENT;
  }
  return pVar5;
}

Assistant:

point_list_differences
find_differences(Am_Point_List &old, Am_Point_List &newp, int &index_of_diff)
{
  //  std::cout << "checking differences of " << old << " and " << newp <<std::endl <<std::flush;
  if (old == newp)
    return Am_PL_SAME;
  int length_old = old.Length();
  int length_newp = newp.Length();
  if (length_old == 0)
    return Am_PL_FROM_NOTHING;
  if (length_newp == 0)
    return Am_PL_TO_NOTHING;
  if (length_newp == length_old + 1) {
    //might be new point, see if can find the index of the point that is new
    index_of_diff = find_point_diff(old, newp);
    if (index_of_diff >= 0)
      return Am_PL_ADD_POINT;
  } else if (length_newp == length_old - 1) {
    //might be delete point, see if can find the index of the point that is new
    index_of_diff = find_point_diff(newp, old);
    if (index_of_diff >= 0)
      return Am_PL_REMOVE_POINT;
  }
  return Am_PL_VERY_DIFFERENT;
}